

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::FindExtension
          (ExtensionSet *this,int wire_type,uint32_t field,Message *extendee,ParseContext *ctx,
          ExtensionInfo *extension,bool *was_packed_on_wire)

{
  DescriptorPool *pool;
  MessageFactory *factory;
  bool bVar1;
  Data *pDVar2;
  Descriptor *extendee_00;
  undefined1 local_58 [8];
  DescriptorPoolExtensionFinder finder_1;
  GeneratedExtensionFinder finder;
  ExtensionInfo *extension_local;
  ParseContext *ctx_local;
  Message *extendee_local;
  uint32_t field_local;
  int wire_type_local;
  ExtensionSet *this_local;
  
  pDVar2 = ParseContext::data(ctx);
  if (pDVar2->pool == (DescriptorPool *)0x0) {
    GeneratedExtensionFinder::GeneratedExtensionFinder
              ((GeneratedExtensionFinder *)&finder_1.containing_type_,&extendee->super_MessageLite);
    bVar1 = FindExtensionInfoFromFieldNumber<google::protobuf::internal::GeneratedExtensionFinder>
                      (this,wire_type,field,(GeneratedExtensionFinder *)&finder_1.containing_type_,
                       extension,was_packed_on_wire);
    if (!bVar1) {
      return false;
    }
  }
  else {
    pDVar2 = ParseContext::data(ctx);
    pool = pDVar2->pool;
    pDVar2 = ParseContext::data(ctx);
    factory = pDVar2->factory;
    extendee_00 = Message::GetDescriptor(extendee);
    DescriptorPoolExtensionFinder::DescriptorPoolExtensionFinder
              ((DescriptorPoolExtensionFinder *)local_58,pool,factory,extendee_00);
    bVar1 = FindExtensionInfoFromFieldNumber<google::protobuf::internal::DescriptorPoolExtensionFinder>
                      (this,wire_type,field,(DescriptorPoolExtensionFinder *)local_58,extension,
                       was_packed_on_wire);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ExtensionSet::FindExtension(int wire_type, uint32_t field,
                                 const Message* extendee,
                                 const internal::ParseContext* ctx,
                                 ExtensionInfo* extension,
                                 bool* was_packed_on_wire) {
  if (ctx->data().pool == nullptr) {
    GeneratedExtensionFinder finder(extendee);
    if (!FindExtensionInfoFromFieldNumber(wire_type, field, &finder, extension,
                                          was_packed_on_wire)) {
      return false;
    }
  } else {
    DescriptorPoolExtensionFinder finder(ctx->data().pool, ctx->data().factory,
                                         extendee->GetDescriptor());
    if (!FindExtensionInfoFromFieldNumber(wire_type, field, &finder, extension,
                                          was_packed_on_wire)) {
      return false;
    }
  }
  return true;
}